

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  int *piVar1;
  IndexValue *pIVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false> _Var6;
  _Head_base<0UL,_int_*,_false> _Var7;
  IndexValue *pIVar8;
  Inst *pIVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  SparseSet reachable;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  SparseSetT<void>::SparseSetT(&local_1d8,this->size_);
  fanout->size_ = 0;
  pIVar8 = (fanout->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  if ((pIVar8 != (IndexValue *)0x0) &&
     (_Var6._M_head_impl.len_ = (Deleter)this->start_,
     (uint)_Var6._M_head_impl.len_ <
     (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                    super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
     )) {
    piVar1 = (fanout->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
             _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    piVar1[(int)_Var6._M_head_impl.len_] = 0;
    iVar11 = fanout->size_;
    pIVar8[iVar11].index_ = (int)_Var6._M_head_impl.len_;
    fanout->size_ = iVar11 + 1;
    pIVar8[piVar1[(int)_Var6._M_head_impl.len_]].value_ = 0;
  }
  if (pIVar8 != (fanout->dense_).ptr_._M_t.
                super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl +
                fanout->size_) {
    do {
      local_1d8.size_ = 0;
      SparseSetT<void>::InsertInternal(&local_1d8,true,pIVar8->index_);
      if (local_1d8.size_ != 0) {
        iVar11 = *local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                  ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
        lVar12 = (long)iVar11;
        pIVar9 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar10 = pIVar9[lVar12].out_opcode_;
        _Var7._M_head_impl =
             local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
             .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
        switch(uVar10 & 7) {
        case 0:
          goto switchD_001c8f0a_caseD_0;
        case 1:
          goto switchD_001c8f0a_caseD_1;
        case 2:
          goto switchD_001c8f0a_caseD_2;
        default:
          goto switchD_001c8f0a_caseD_3;
        case 5:
          goto switchD_001c8f0a_caseD_5;
        case 7:
          goto switchD_001c8f0a_caseD_7;
        }
      }
LAB_001c9070:
      pIVar8 = pIVar8 + 1;
    } while (pIVar8 != (fanout->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                       .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>.
                       _M_head_impl + fanout->size_);
  }
  SparseSetT<void>::~SparseSetT(&local_1d8);
  return;
  do {
    iVar11 = *_Var7._M_head_impl;
    lVar12 = (long)iVar11;
    pIVar9 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar10 = pIVar9[lVar12].out_opcode_;
    switch(uVar10 & 7) {
    case 0:
switchD_001c8f0a_caseD_0:
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                 ,0x2cf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10)
      ;
      poVar5 = (ostream *)
               std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar9[lVar12].out_opcode_ & 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," in Prog::Fanout()",0x12);
      LogMessage::~LogMessage(&local_1b0);
    case 7:
switchD_001c8f0a_caseD_7:
      _Var7._M_head_impl = _Var7._M_head_impl + 1;
      if (_Var7._M_head_impl ==
          local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1d8.size_) goto LAB_001c9070;
      break;
    case 2:
switchD_001c8f0a_caseD_2:
      if ((uVar10 & 8) == 0) {
        SparseSetT<void>::InsertInternal(&local_1d8,true,(int)lVar12 + 1);
      }
      pIVar8->value_ = pIVar8->value_ + 1;
      _Var6._M_head_impl.len_ = (Deleter)(pIVar9[lVar12].out_opcode_ >> 4);
      pIVar2 = (fanout->dense_).ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
      bVar3 = (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                             super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                             .
                             super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                             .
                             super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
              <= (uint)_Var6._M_head_impl.len_;
      bVar4 = bVar3 || pIVar2 == (IndexValue *)0x0;
      if (!bVar3 && pIVar2 != (IndexValue *)0x0) {
        uVar10 = (fanout->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                 ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)_Var6._M_head_impl.len_];
        if (uVar10 < (uint)fanout->size_) {
          if (bVar4 || (Deleter)pIVar2[(int)uVar10].index_ == _Var6._M_head_impl.len_)
          goto switchD_001c8f0a_caseD_7;
        }
        else if (bVar4) goto switchD_001c8f0a_caseD_7;
        piVar1 = (fanout->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                 ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        piVar1[(uint)_Var6._M_head_impl.len_] = fanout->size_;
        iVar11 = fanout->size_;
        pIVar2[iVar11].index_ = (int)_Var6._M_head_impl.len_;
        fanout->size_ = iVar11 + 1;
        pIVar2[piVar1[(uint)_Var6._M_head_impl.len_]].value_ = 0;
      }
      goto switchD_001c8f0a_caseD_7;
    default:
switchD_001c8f0a_caseD_3:
      if ((uVar10 & 8) == 0) {
        SparseSetT<void>::InsertInternal(&local_1d8,true,(int)lVar12 + 1);
      }
      uVar10 = pIVar9[lVar12].out_opcode_ >> 4;
      goto LAB_001c9059;
    case 5:
switchD_001c8f0a_caseD_5:
      if ((uVar10 & 8) != 0) goto switchD_001c8f0a_caseD_7;
    case 1:
switchD_001c8f0a_caseD_1:
      uVar10 = iVar11 + 1;
LAB_001c9059:
      SparseSetT<void>::InsertInternal(&local_1d8,true,uVar10);
      goto switchD_001c8f0a_caseD_7;
    }
  } while( true );
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->value();
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}